

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O1

int Imf_3_2::numLinesInBuffer(Compression comp)

{
  ArgExc *this;
  
  if (comp < NUM_COMPRESSION_METHODS) {
    return *(int *)(&DAT_002049a8 + (ulong)comp * 4);
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this,"Unknown compression type");
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

int
numLinesInBuffer (Compression comp)
{
    switch (comp)
    {
        case NO_COMPRESSION:
        case RLE_COMPRESSION:
        case ZIPS_COMPRESSION: return 1;
        case ZIP_COMPRESSION: return 16;
        case PIZ_COMPRESSION: return 32;
        case PXR24_COMPRESSION: return 16;
        case B44_COMPRESSION:
        case B44A_COMPRESSION:
        case DWAA_COMPRESSION: return 32;
        case DWAB_COMPRESSION: return 256;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown compression type");
    }
}